

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_vdpu2.c
# Opt level: O2

MPP_RET hal_vpu2_h263d_gen_regs(void *hal,HalTaskInfo *syn)

{
  undefined4 uVar1;
  void *pvVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  MppBuffer buf_pkt;
  long local_50;
  void *local_48;
  MppBuffer buf_frm_ref0;
  MppBuffer buf_frm_curr;
  
  buf_frm_curr = (MppBuffer)0x0;
  buf_frm_ref0 = (MppBuffer)0x0;
  buf_pkt = (MppBuffer)0x0;
  pvVar2 = *(void **)((long)hal + 0x88);
  if (((((syn->dec).valid == 0) &&
       (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->valid",
                   "hal_vpu2_h263d_gen_regs",0xbe), (mpp_debug._3_1_ & 0x10) != 0)) ||
      (((syn->dec).input < 0 &&
       (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->input >= 0"
                   ,"hal_vpu2_h263d_gen_regs",0xbf), (mpp_debug._3_1_ & 0x10) != 0)))) ||
     (((syn->dec).output < 0 &&
      (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->output >= 0"
                  ,"hal_vpu2_h263d_gen_regs",0xc0), (mpp_debug._3_1_ & 0x10) != 0)))) {
LAB_001e1b5a:
    abort();
  }
  memset(pvVar2,0,0x27c);
  *(undefined4 *)((long)pvVar2 + 0xd8) = 0x3f;
  *(undefined8 *)((long)pvVar2 + 0xe0) = 0x3100100000;
  *(undefined4 *)((long)pvVar2 + 0xd0) = 0x20000;
  *(undefined4 *)((long)pvVar2 + 0xec) = 0xffc03fe8;
  *(undefined4 *)((long)pvVar2 + 0x264) = 0x5000000;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x60),(syn->dec).input,SLOT_BUFFER,&buf_pkt);
  if ((buf_pkt == (MppBuffer)0x0) &&
     (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pkt",
                 "hal_vpu2_h263d_gen_regs",0xd9), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_001e1b5a;
  vpu_h263d_get_buffer_by_index((hal_h263_ctx *)hal,(syn->dec).output,&buf_frm_curr);
  vpu_h263d_get_buffer_by_index((hal_h263_ctx *)hal,(syn->dec).refer[0],&buf_frm_ref0);
  iVar5 = mpp_buffer_get_fd_with_caller(buf_frm_curr,"hal_vpu2_h263d_gen_regs");
  *(int *)((long)hal + 0x7c) = iVar5;
  if (buf_frm_ref0 == (MppBuffer)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = mpp_buffer_get_fd_with_caller(buf_frm_ref0,"hal_vpu2_h263d_gen_regs");
    iVar5 = *(int *)((long)hal + 0x7c);
  }
  *(int *)((long)hal + 0x80) = iVar6;
  *(int *)((long)pvVar2 + 0xfc) = iVar5;
  iVar5 = mpp_buffer_get_fd_with_caller(buf_pkt,"hal_vpu2_h263d_gen_regs");
  *(int *)((long)pvVar2 + 0x100) = iVar5;
  uVar7 = (syn->dec).syntax.number;
  pvVar2 = (syn->dec).syntax.data;
  local_50 = *(long *)((long)hal + 0x88);
  uVar11 = 0;
  iVar5 = 0;
  lVar13 = 0;
  local_48 = hal;
  for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    piVar3 = *(int **)((long)pvVar2 + uVar12 * 8);
    if (*piVar3 == 6) {
      uVar11 = piVar3[2];
      iVar5 = piVar3[3];
    }
    else if (*piVar3 == 0) {
      lVar13 = *(long *)(piVar3 + 10);
    }
    else {
      _mpp_log_l(2,"hal_vpu_h263d","found invalid buffer descriptor type %d\n",
                 "vpu2_h263d_setup_regs_by_syntax");
    }
  }
  if ((((lVar13 == 0) &&
       (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"pp",
                   "vpu2_h263d_setup_regs_by_syntax",0x39), (mpp_debug._3_1_ & 0x10) != 0)) ||
      ((pvVar2 = local_48, iVar5 == 0 &&
       (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_length",
                   "vpu2_h263d_setup_regs_by_syntax",0x3a), (mpp_debug._3_1_ & 0x10) != 0)))) ||
     ((lVar4 = local_50, uVar11 == 0 &&
      (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_used",
                  "vpu2_h263d_setup_regs_by_syntax",0x3b), (mpp_debug._3_1_ & 0x10) != 0))))
  goto LAB_001e1b5a;
  uVar8 = *(int *)(lVar13 + 0x24) * 0x80000 + 0x780000U & 0xff800000;
  uVar7 = *(uint *)(lVar4 + 0x1e0);
  *(uint *)(lVar4 + 0x1e0) = uVar7 & 0x7fffff | uVar8;
  uVar9 = (uint)*(ushort *)(lVar13 + 0x26) * 0x80 + 0x780 & 0x7f800;
  *(uint *)(lVar4 + 0x1e0) = uVar7 & 0x7807ff | uVar8 | uVar9;
  uVar10 = (*(ushort *)(lVar13 + 0x24) & 0xf) << 0x13;
  *(uint *)(lVar4 + 0x1e0) = uVar7 & 0x7ff | uVar8 | uVar9 | uVar10;
  *(uint *)(lVar4 + 0x1e0) =
       uVar7 & 0x7f | uVar8 | uVar9 | uVar10 | (*(ushort *)(lVar13 + 0x26) & 0xf) << 7;
  *(undefined4 *)(lVar4 + 0xd4) = 2;
  *(byte *)(lVar4 + 0xc9) = *(byte *)(lVar4 + 0xc9) | 1;
  *(byte *)(lVar4 + 0x220) = *(byte *)(lVar4 + 0x220) & 0xfd;
  uVar7 = *(uint *)(lVar4 + 0xcc) & 0x81ffffff | (*(byte *)(lVar13 + 2) & 0x3f) << 0x19;
  *(uint *)(lVar4 + 0xcc) = uVar7;
  uVar8 = *(uint *)(lVar4 + 0x1e8) | 0x2000000;
  *(uint *)(lVar4 + 0x1e8) = uVar8;
  uVar1 = *(undefined4 *)(lVar4 + 0x100);
  uVar9 = uVar11 >> 3 & 0x1ffffff8;
  if (uVar9 != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar2 + 0x70),0x40,uVar9);
    uVar7 = *(uint *)(lVar4 + 0xcc);
    uVar8 = *(uint *)(lVar4 + 0x1e8);
  }
  *(undefined4 *)(lVar4 + 0x100) = uVar1;
  uVar11 = uVar8 & 0x3ffffff | uVar11 << 0x1a;
  *(uint *)(lVar4 + 0x1e8) = uVar11;
  *(uint *)(lVar4 + 0xcc) = uVar7 & 0xff000000 | iVar5 - uVar9 & 0xffffff;
  *(uint *)(lVar4 + 0x1e8) = CONCAT22((short)(uVar11 >> 0x10),*(undefined2 *)(lVar13 + 0xc));
  if (*(char *)(lVar13 + 1) == '\0') {
    *(byte *)(lVar4 + 0xe5) = *(byte *)(lVar4 + 0xe5) & 0xbf;
LAB_001e1b07:
    iVar5 = *(int *)((long)pvVar2 + 0x7c);
  }
  else {
    if (*(char *)(lVar13 + 1) != '\x01') goto LAB_001e1b19;
    *(byte *)(lVar4 + 0xe5) = *(byte *)(lVar4 + 0xe5) | 0x40;
    iVar5 = *(int *)((long)pvVar2 + 0x80);
    if (iVar5 < 0) goto LAB_001e1b07;
  }
  *(int *)(lVar4 + 0x20c) = iVar5;
  *(int *)(lVar4 + 0x250) = iVar5;
LAB_001e1b19:
  uVar7 = *(uint *)(lVar4 + 0x220);
  *(uint *)(lVar4 + 0x220) = uVar7 & 0xfff807ff | 0x8800;
  *(uint *)(lVar4 + 0x220) = uVar7 & 0xfff807fe | 0x8800 | (uint)(*(int *)(lVar13 + 0x44) == 1);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vpu2_h263d_gen_regs(void *hal,  HalTaskInfo *syn)
{
    MPP_RET ret = MPP_OK;
    hal_h263_ctx *ctx = (hal_h263_ctx *)hal;
    HalDecTask *task = &syn->dec;
    MppBuffer buf_frm_curr = NULL;
    MppBuffer buf_frm_ref0 = NULL;
    MppBuffer buf_pkt = NULL;
    Vpu2H263dRegSet_t *regs = (Vpu2H263dRegSet_t*)ctx->regs;

    mpp_assert(task->valid);
    mpp_assert(task->input >= 0);
    mpp_assert(task->output >= 0);

    memset(regs, 0, sizeof(Vpu2H263dRegSet_t));

    /*
     * basic register configuration setup here
     */
    regs->reg54_endian.sw_dec_out_endian = 1;
    regs->reg54_endian.sw_dec_in_endian = 1;
    regs->reg54_endian.sw_dec_inswap32_e = 1;
    regs->reg54_endian.sw_dec_outswap32_e = 1;
    regs->reg54_endian.sw_dec_strswap32_e = 1;
    regs->reg54_endian.sw_dec_strendian_e = 1;
    regs->reg56_axi_ctrl.sw_dec_max_burst = 16;
    regs->reg52_error_concealment.sw_apf_threshold = 1;
    regs->reg57_enable_ctrl.sw_dec_timeout_e = 1;
    regs->reg57_enable_ctrl.sw_dec_clk_gate_e = 1;
    regs->reg57_enable_ctrl.sw_dec_e = 1;
    regs->reg59.sw_pred_bc_tap_0_0 = -1;
    regs->reg59.sw_pred_bc_tap_0_1 = 3;
    regs->reg59.sw_pred_bc_tap_0_2 = -6;
    regs->reg153.sw_pred_bc_tap_0_3 = 20;

    /* setup buffer for input / output / reference */
    mpp_buf_slot_get_prop(ctx->pkt_slots, task->input, SLOT_BUFFER, &buf_pkt);
    mpp_assert(buf_pkt);
    vpu_h263d_get_buffer_by_index(ctx, task->output, &buf_frm_curr);
    vpu_h263d_get_buffer_by_index(ctx, task->refer[0], &buf_frm_ref0);

    /* address registers setup first */
    ctx->fd_curr = mpp_buffer_get_fd(buf_frm_curr);
    ctx->fd_ref0 = (buf_frm_ref0) ? (mpp_buffer_get_fd(buf_frm_ref0)) : (-1);
    regs->reg63_cur_pic_base = (RK_U32)ctx->fd_curr;
    regs->reg64_input_stream_base = mpp_buffer_get_fd(buf_pkt);

    /* setup other registers, here will update packet address */
    vpu2_h263d_setup_regs_by_syntax(ctx, task->syntax);

    return ret;
}